

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

PvrLegacyInfo * __thiscall PvrLegacyInfo::PrintFlagNames_abi_cxx11_(PvrLegacyInfo *this,uint flags)

{
  pointer ppVar1;
  key_type local_144;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [36];
  key_type local_114;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [36];
  key_type local_e4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [36];
  key_type local_b4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [36];
  key_type local_84;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [52];
  key_type local_44;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [35];
  undefined1 local_15;
  uint local_14;
  PvrLegacyInfo *pPStack_10;
  uint flags_local;
  string *output;
  
  local_15 = 0;
  local_14 = flags;
  pPStack_10 = this;
  std::__cxx11::string::string((string *)this);
  if ((local_14 & 0x100) != 0) {
    local_44 = 0x100;
    local_40._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)flag_names_abi_cxx11_,&local_44);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    std::operator+(local_38,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((local_14 & 0x400) != 0) {
    local_84 = 0x400;
    local_80._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)flag_names_abi_cxx11_,&local_84);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_80);
    std::operator+(local_78,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_14 & 0x1000) != 0) {
    local_b4 = 0x1000;
    local_b0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)flag_names_abi_cxx11_,&local_b4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b0);
    std::operator+(local_a8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_a8);
  }
  if ((local_14 & 0x4000) != 0) {
    local_e4 = 0x4000;
    local_e0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)flag_names_abi_cxx11_,&local_e4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_e0);
    std::operator+(local_d8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_d8);
  }
  if ((local_14 & 0x8000) != 0) {
    local_114 = 0x8000;
    local_110._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)flag_names_abi_cxx11_,&local_114);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_110);
    std::operator+(local_108,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_108);
  }
  if ((local_14 & 0x10000) != 0) {
    local_144 = 0x10000;
    local_140._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)flag_names_abi_cxx11_,&local_144);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_140);
    std::operator+(local_138,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_138);
  }
  RemoveTrailingCharacter((string *)this,'|');
  return this;
}

Assistant:

std::string PrintFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,flag_names)
    #include "defs/pvrLegacy/flags.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }